

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O2

void pzshape::TPZShapeCube::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double local_98;
  TPZStack<int,_10> highsides;
  
  for (lVar10 = 8; lVar10 != 0x14; lVar10 = lVar10 + 1) {
    if (nshape->fStore[lVar10 + -8] != 0) {
      iVar6 = pztopology::TPZCube::ContainedSideLocId((int)lVar10,0);
      iVar7 = pztopology::TPZCube::ContainedSideLocId((int)lVar10,1);
      lVar11 = (long)iVar6;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar1 = *pdVar8;
      lVar9 = (long)iVar7;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar10,0);
      *pdVar8 = dVar1 * dVar2;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar11);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar3 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar9);
      dVar4 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar10);
      *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar11);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar3 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar9);
      dVar4 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar10);
      *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar11);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      dVar2 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
      dVar3 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar9);
      dVar4 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar10);
      *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
    }
  }
  for (lVar10 = 0x14; lVar10 != 0x1a; lVar10 = lVar10 + 1) {
    iVar6 = pztopology::TPZCube::ContainedSideLocId((int)lVar10,0);
    iVar7 = pztopology::TPZCube::ContainedSideLocId((int)lVar10,2);
    lVar9 = (long)iVar6;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    dVar1 = *pdVar8;
    lVar11 = (long)iVar7;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    dVar2 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar10,0);
    *pdVar8 = dVar1 * dVar2;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar9);
    dVar1 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    dVar2 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    dVar3 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar11);
    dVar4 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar10);
    *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar9);
    dVar1 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    dVar2 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    dVar3 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar11);
    dVar4 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar10);
    *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar9);
    dVar1 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar11,0);
    dVar2 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
    dVar3 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar11);
    dVar4 = *pdVar8;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar10);
    *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
  }
  pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,6,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,0x1a,0);
  *pdVar8 = dVar1 * dVar2;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,0,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,6,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,0,6);
  dVar4 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,0,0x1a);
  *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,1,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,6,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,1,6);
  dVar4 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,1,0x1a);
  *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,2,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,6,0);
  dVar2 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,2,6);
  dVar4 = *pdVar8;
  pdVar8 = TPZFMatrix<double>::operator()(dphi,2,0x1a);
  *pdVar8 = dVar3 * dVar4 + dVar1 * dVar2;
  for (lVar10 = 8; lVar10 != 0x1b; lVar10 = lVar10 + 1) {
    TPZStack<int,_10>::TPZStack(&highsides);
    pztopology::TPZCube::HigherDimensionSides((int)lVar10,&highsides);
    uVar5 = (uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements;
    if ((int)(uint)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fNElements < 1) {
      uVar5 = 0;
    }
    for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
      lVar9 = (long)highsides.super_TPZManVector<int,_10>.super_TPZVec<int>.fStore[uVar12];
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar9,0);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(phi,lVar10,0);
      *pdVar8 = dVar1 + *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar9);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar10);
      *pdVar8 = dVar1 + *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar9);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar10);
      *pdVar8 = dVar1 + *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar9);
      dVar1 = *pdVar8;
      pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar10);
      *pdVar8 = dVar1 + *pdVar8;
    }
    iVar6 = pztopology::TPZCube::SideDimension((int)lVar10);
    local_98 = 4.0;
    if (iVar6 != 1) {
      if (iVar6 == 2) {
        local_98 = 16.0;
      }
      else {
        local_98 = (double)((uint)(iVar6 == 3) << 6);
      }
    }
    pdVar8 = TPZFMatrix<double>::operator()(phi,lVar10,0);
    *pdVar8 = *pdVar8 * local_98;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,0,lVar10);
    *pdVar8 = *pdVar8 * local_98;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,1,lVar10);
    *pdVar8 = *pdVar8 * local_98;
    pdVar8 = TPZFMatrix<double>::operator()(dphi,2,lVar10);
    *pdVar8 = local_98 * *pdVar8;
    TPZManVector<int,_10>::~TPZManVector(&highsides.super_TPZManVector<int,_10>);
  }
  return;
}

Assistant:

void TPZShapeCube::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
{
    int is;
    // contribute the ribs
    for(is=8; is<20; is++)
    {
        if(nshape[is-8] == 0) continue;
        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,1);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the faces
    for(is=20; is<26; is++)
    {

        int is1,is2;
        is1 = ContainedSideLocId(is,0);
        is2 = ContainedSideLocId(is,2);
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }
    // contribution of the volume
    for(is=26; is<27; is++)
    {

        int is1,is2;
        is1 = 0;
        is2 = 6;
        phi(is,0) = phi(is1,0)*phi(is2,0);
        dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
        dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
        dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
    }

    // Make the generating shape functions linear and unitary
    for(is=8; is<27; is++)
    {
        TPZStack<int> highsides;
        HigherDimensionSides(is,highsides);
        int h, nh = highsides.NElements();
        for(h=0; h<nh; h++)
        {
            int hs = highsides[h];
            phi(is,0) += phi(hs,0);
            dphi(0,is) += dphi(0,hs);
            dphi(1,is) += dphi(1,hs);
            dphi(2,is) += dphi(2,hs);
        }
        int dim = SideDimension(is);
        int mult = (dim == 1) ? 4 : (dim == 2) ? 16 : (dim ==3) ? 64 : 0;
        phi(is,0) *= mult;
        dphi(0,is) *= mult;
        dphi(1,is) *= mult;
        dphi(2,is) *= mult;
    }

}